

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadContactSurfaceMesh.cpp
# Opt level: O2

int __thiscall chrono::fea::ChLoadContactSurfaceMesh::LoadGet_ndof_w(ChLoadContactSurfaceMesh *this)

{
  pointer psVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int i;
  ulong uVar5;
  
  lVar4 = 0;
  uVar5 = 0;
  iVar3 = 0;
  while( true ) {
    psVar1 = (this->forces).
             super__Vector_base<std::shared_ptr<chrono::ChLoadXYZnode>,_std::allocator<std::shared_ptr<chrono::ChLoadXYZnode>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->forces).
                      super__Vector_base<std::shared_ptr<chrono::ChLoadXYZnode>,_std::allocator<std::shared_ptr<chrono::ChLoadXYZnode>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4) <= uVar5)
    break;
    iVar2 = (**(code **)(**(long **)((long)&(psVar1->
                                            super___shared_ptr<chrono::ChLoadXYZnode,_(__gnu_cxx::_Lock_policy)2>
                                            )._M_ptr + lVar4) + 0x38))();
    iVar3 = iVar3 + iVar2;
    uVar5 = uVar5 + 1;
    lVar4 = lVar4 + 0x10;
  }
  return iVar3;
}

Assistant:

int ChLoadContactSurfaceMesh::LoadGet_ndof_w() {
    int ndoftot = 0;
    for (int i = 0; i < forces.size(); ++i)
        ndoftot += forces[i]->LoadGet_ndof_w();
    return ndoftot;
}